

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

floatx80 propagateFloatx80NaN_mips64(floatx80 a,floatx80 b,float_status *status)

{
  undefined1 auVar1 [12];
  int iVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint64_t uVar8;
  bool bVar9;
  bool bVar10;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 fVar11;
  floatx80 fVar12;
  
  fVar11.low = a.low;
  uVar4 = b._8_4_;
  uVar6 = a._8_8_ & 0xffffffff;
  bVar7 = 2;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
      (~a._8_4_ & 0x7fff) == 0) {
    fVar11._8_8_ = uVar6;
    iVar2 = floatx80_is_signaling_nan_mips64(fVar11,status);
    bVar7 = iVar2 == 0 ^ 5;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
      (~uVar4 & 0x7fff) != 0) {
    if (bVar7 != 5) goto LAB_007943bf;
    cVar3 = '\x02';
    bVar9 = true;
LAB_007943b2:
    status->float_exception_flags = status->float_exception_flags | 1;
    bVar10 = cVar3 == '\x05';
  }
  else {
    auVar1 = b._0_12_;
    a_00._12_4_ = 0;
    a_00.low = auVar1._0_8_;
    a_00.high = auVar1._8_2_;
    a_00._10_2_ = auVar1._10_2_;
    iVar2 = floatx80_is_signaling_nan_mips64(a_00,status);
    bVar9 = bVar7 == 5;
    cVar3 = '\x05';
    if (bVar9) {
      cVar3 = (iVar2 != 0) + '\x04';
    }
    if (iVar2 != 0 || bVar9) goto LAB_007943b2;
LAB_007943bf:
    bVar9 = false;
    bVar10 = false;
  }
  if (status->default_nan_mode == '\0') {
    if (!bVar9) {
      if (!bVar10) {
        uVar8 = b.low;
        if (bVar7 == 4) {
          uVar8 = fVar11.low;
        }
        uVar5 = (ulong)uVar4;
        if (bVar7 == 4) {
          uVar5 = uVar6;
        }
        goto LAB_00794410;
      }
      uVar6 = (ulong)uVar4;
      fVar11.low = b.low;
    }
    a_01._8_8_ = uVar6;
    a_01.low = fVar11.low;
    fVar11 = floatx80_silence_nan_mips64(a_01,status);
    uVar8 = fVar11.low;
    uVar5 = (ulong)fVar11._8_4_;
  }
  else {
    floatx80_default_nan_mips64(status);
    uVar8 = 0xc000000000000000;
    uVar5 = CONCAT62((uint6)b._10_2_,0xffff);
  }
LAB_00794410:
  fVar12._8_8_ = uVar5;
  fVar12.low = uVar8;
  return fVar12;
}

Assistant:

floatx80 propagateFloatx80NaN(floatx80 a, floatx80 b, float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!floatx80_is_any_nan(a)
             ? float_class_normal
             : floatx80_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!floatx80_is_any_nan(b)
             ? float_class_normal
             : floatx80_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.low < b.low) {
        aIsLargerSignificand = 0;
    } else if (b.low < a.low) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return floatx80_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return floatx80_silence_nan(a, status);
        }
        return a;
    }
}